

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O0

void __thiscall kj::_::BTreeImpl::merge(BTreeImpl *this,Leaf *dst,uint dstPos,uint pivot,Leaf *src)

{
  bool bVar1;
  size_t mid;
  Fault f_1;
  Fault local_30;
  Fault f;
  Leaf *src_local;
  uint pivot_local;
  uint dstPos_local;
  Leaf *dst_local;
  BTreeImpl *this_local;
  
  f.exception = (Exception *)src;
  bVar1 = Leaf::isHalfFull(src);
  if (!bVar1) {
    Debug::Fault::Fault(&local_30,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.c++"
                        ,0x29c,FAILED,"src.isHalfFull()","");
    Debug::Fault::fatal(&local_30);
  }
  bVar1 = Leaf::isHalfFull(dst);
  if (!bVar1) {
    Debug::Fault::Fault((Fault *)&mid,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.c++"
                        ,0x29d,FAILED,"dst.isHalfFull()","");
    Debug::Fault::fatal((Fault *)&mid);
  }
  MaybeUint::operator=(dst->rows + 7,pivot);
  acopy<kj::_::BTreeImpl::MaybeUint>
            (dst->rows + 7,(MaybeUint *)&((f.exception)->ownFile).content.size_,7);
  dst->next = *(uint *)&((f.exception)->ownFile).content.ptr;
  if (dst->next == 0) {
    this->endLeaf = dstPos;
  }
  else {
    this->tree[dst->next].field_0.freelist.zero[0] = dstPos;
  }
  return;
}

Assistant:

void BTreeImpl::merge(Leaf& dst, uint dstPos, uint pivot, Leaf& src) {
  // merge() is only legal if both nodes are half-empty. Meanwhile, B-tree invariants
  // guarantee that the node can't be more than half-empty, or we would have merged it sooner.
  // (The root can be more than half-empty, but it is never merged with anything.)
  KJ_DASSERT(src.isHalfFull());
  KJ_DASSERT(dst.isHalfFull());

  constexpr size_t mid = Leaf::NROWS/2;
  dst.rows[mid] = pivot;
  acopy(dst.rows + mid, src.rows, mid);

  dst.next = src.next;
  if (dst.next == 0) {
    endLeaf = dstPos;
  } else {
    tree[dst.next].leaf.prev = dstPos;
  }
}